

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

void __thiscall
LowererMD::EmitFloatToInt
          (LowererMD *this,Opnd *dst,Opnd *src,Instr *instrInsert,Instr *instrBailOut,
          LabelInstr *labelBailOut)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind kind;
  LabelInstr *labelDone;
  LabelInstr *instr;
  RegOpnd *dst_00;
  Instr *instr_00;
  BailOutInfo *pBVar3;
  Instr *instr_01;
  undefined4 *puVar4;
  LabelInstr *labelHelper;
  
  labelHelper = (LabelInstr *)instrInsert;
  kind = BailOutInvalid;
  if (((instrBailOut != (Instr *)0x0) &&
      (kind = BailOutInvalid, (instrBailOut->field_0x38 & 0x10) != 0)) &&
     (kind = IR::Instr::GetBailOutKind(instrBailOut), (kind >> 0x11 & 1) != 0)) {
    if (labelBailOut == (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1ce7,"(labelBailOut)","labelBailOut");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    Lowerer::InsertBranch(Br,labelBailOut,instrInsert);
    return;
  }
  labelDone = IR::LabelInstr::New(Label,this->m_func,false);
  instr = IR::LabelInstr::New(Label,this->m_func,true);
  ConvertFloatToInt32(this,dst,src,labelHelper,labelDone,instrInsert);
  IR::Instr::InsertBefore(instrInsert,&instr->super_Instr);
  dst_00 = (RegOpnd *)src;
  if (src->m_type == TyFloat32) {
    dst_00 = IR::RegOpnd::New(TyFloat64,this->m_func);
    EmitFloat32ToFloat64(this,&dst_00->super_Opnd,src,instrInsert);
  }
  instr_00 = IR::Instr::New(CALL,dst,this->m_func);
  IR::Instr::InsertBefore(instrInsert,instr_00);
  if ((kind & ~(BailOutKindBits|BailOutIntOnly)) == BailOutOnImplicitCalls) {
    pBVar3 = IR::Instr::GetBailOutInfo(instrBailOut);
    instr_00 = IR::Instr::ConvertToBailOutInstr(instr_00,pBVar3,kind,false);
    pBVar3 = IR::Instr::GetBailOutInfo(instrBailOut);
    if (pBVar3->bailOutInstr == instrBailOut) {
      instr_01 = IR::Instr::ShareBailOut(instrBailOut);
      Lowerer::LowerBailTarget(this->m_lowerer,instr_01);
    }
  }
  LowererMDArch::LoadDoubleHelperArgument(&this->lowererMDArch,instr_00,&dst_00->super_Opnd);
  ChangeToHelperCall(this,instr_00,HelperConv_ToInt32Core,(LabelInstr *)0x0,(Opnd *)0x0,
                     (PropertySymOpnd *)0x0,false);
  IR::Instr::InsertBefore(instrInsert,&labelDone->super_Instr);
  return;
}

Assistant:

void
LowererMD::EmitFloatToInt(IR::Opnd *dst, IR::Opnd *src, IR::Instr *instrInsert, IR::Instr *instrBailOut, IR::LabelInstr * labelBailOut)
{
#ifdef _M_IX86
    // We should only generate this if sse2 is available
    Assert(AutoSystemInfo::Data.SSE2Available());
#endif

    IR::BailOutKind bailOutKind = IR::BailOutInvalid;
    if (instrBailOut && instrBailOut->HasBailOutInfo())
    {
        bailOutKind = instrBailOut->GetBailOutKind();
        if (bailOutKind & IR::BailOutOnArrayAccessHelperCall)
        {
            // Bail out instead of calling helper. If this is happening unconditionally, the caller should instead throw a rejit exception.
            Assert(labelBailOut);
            m_lowerer->InsertBranch(Js::OpCode::Br, labelBailOut, instrInsert);
            return;
        }
    }

    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    IR::Instr *instr;

    ConvertFloatToInt32(dst, src, labelHelper, labelDone, instrInsert);

    // $Helper
    instrInsert->InsertBefore(labelHelper);

    IR::Opnd * arg = src;
    if (src->IsFloat32())
    {
        arg = IR::RegOpnd::New(TyFloat64, m_func);

        EmitFloat32ToFloat64(arg, src, instrInsert);
    }

    instr = IR::Instr::New(Js::OpCode::CALL, dst, this->m_func);
    instrInsert->InsertBefore(instr);

    if (BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind))
    {
        _Analysis_assume_(instrBailOut != nullptr);

        instr = instr->ConvertToBailOutInstr(instrBailOut->GetBailOutInfo(), bailOutKind);
        if (instrBailOut->GetBailOutInfo()->bailOutInstr == instrBailOut)
        {
            IR::Instr * instrShare = instrBailOut->ShareBailOut();
            m_lowerer->LowerBailTarget(instrShare);
        }
    }

    // dst = ToInt32Core(src);
    LoadDoubleHelperArgument(instr, arg);

    this->ChangeToHelperCall(instr, IR::HelperConv_ToInt32Core);

    // $Done
    instrInsert->InsertBefore(labelDone);
}